

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int savePPM(char *path,uchar *pixels,uint sx,uint sy)

{
  uint uVar1;
  FILE *__stream;
  size_t sVar2;
  ulong __n;
  
  __stream = fopen(path,"wb");
  if (__stream == (FILE *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    fprintf(__stream,"P6\n%d %d\n255\n",(ulong)sx,(ulong)sy);
    __n = (ulong)(sx * sy * 3);
    sVar2 = fwrite(pixels,1,__n,__stream);
    fclose(__stream);
    uVar1 = (uint)(sVar2 != __n);
  }
  return uVar1;
}

Assistant:

int savePPM(const char *path, const unsigned char *pixels, const unsigned int sx, const unsigned int sy)
{
    FILE *fp = fopen(path, "wb");
    if (!fp)
        return -1;
    fprintf(fp, "P6\n%d %d\n255\n", sx, sy);
    size_t pixelsLen = 3 * sx * sy;
    size_t written = fwrite(pixels, sizeof pixels[0], pixelsLen, fp);
    fclose(fp);
    return written != pixelsLen;
}